

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O3

void test_skiplist_delete_then_insert_single(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  ion_skiplist_t skiplist;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  ion_skiplist_t local_58;
  
  sl_initialize(&local_58,key_type_numeric_signed,4,10,7,1,4);
  local_58.super.compare = dictionary_compare_signed_value;
  local_5c = 0x42;
  iVar2 = sl_insert(&local_58,&local_5c,"toaster");
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar2.error == '\0'),0x63e,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2.count == 1),0x63f,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      local_60 = 0x42;
      iVar2 = sl_delete(&local_58,&local_60);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar2.error == '\0'),0x648,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                         ,"condition was false, expected true");
      if (pVar1 != '\0') {
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(((ulong)iVar2 & 0xffffffff00000000) == 0x100000000),0x649,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                           ,"condition was false, expected true");
        if (pVar1 != '\0') {
          local_64 = 0x16d;
          iVar2 = sl_insert(&local_58,&local_64,"potato");
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(iVar2.error == '\0'),0x657,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                             ,"condition was false, expected true");
          if (pVar1 != '\0') {
            pVar1 = planck_unit_assert_true
                              (tc,(uint)(((ulong)iVar2 & 0xffffffff00000000) == 0x100000000),0x658,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                               ,"condition was false, expected true");
            if (pVar1 != '\0') {
              pVar1 = planck_unit_assert_true
                                (tc,(uint)(*(local_58.head)->next != (sl_node *)0x0),0x659,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                                 ,"condition was false, expected true");
              if (pVar1 != '\0') {
                pVar1 = planck_unit_assert_true
                                  (tc,(uint)(*(*(local_58.head)->next)->key == 0x16d),0x65a,
                                   "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                                   ,"condition was false, expected true");
                if (pVar1 != '\0') {
                  pVar1 = planck_unit_assert_str_are_equal
                                    (tc,(char *)(*(local_58.head)->next)->value,"potato",0x65b,
                                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                                    );
                  if (pVar1 != '\0') {
                    sl_destroy(&local_58);
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_delete_then_insert_single(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_status_t status = sl_insert(&skiplist, IONIZE(66, int), (ion_value_t) (char *) { "toaster" });

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

#if ION_DEBUG
	printf("%s\n", "** INSERT **");
	print_skiplist(&skip_list);
#endif

	status = sl_delete(&skiplist, IONIZE(66, int));

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

#if ION_DEBUG
	printf("%s\n", "** DELETE **");
	print_skiplist(&skip_list);
#endif

	status = sl_insert(&skiplist, IONIZE(365, int), (ion_value_t) (char *) { "potato" });

#if ION_DEBUG
	printf("%s\n", "** REINSERT **");
	print_skiplist(&skip_list);
#endif

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	PLANCK_UNIT_ASSERT_TRUE(tc, skiplist.head->next[0] != NULL);
	PLANCK_UNIT_ASSERT_TRUE(tc, *(int *) skiplist.head->next[0]->key == 365);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) skiplist.head->next[0]->value, "potato");

	sl_destroy(&skiplist);
}